

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

int AF_DObject_S_ChangeMusic
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  VMValue *pVVar2;
  int iVar3;
  char *pcVar4;
  FString music;
  FString local_30;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x02') {
      FString::AttachToOther(&local_30,(FString *)param);
      if (numparam == 1) {
        pVVar2 = defaultparam->Array;
        if (defaultparam->Array[1].field_0.field_3.Type == '\0') {
LAB_002fe376:
          if (numparam < 3) {
            pcVar4 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\0') {
              if (numparam == 3) {
                pcVar4 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\0') {
                  bVar1 = S_ChangeMusic(local_30.Chars,pVVar2[1].field_0.i,param[2].field_0.i != 0,
                                        param[3].field_0.i != 0);
                  if (numret < 1) {
                    iVar3 = 0;
                  }
                  else {
                    if (ret == (VMReturn *)0x0) {
                      __assert_fail("ret != NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                                    ,0xa39,
                                    "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    if (ret->RegType != '\0') {
                      __assert_fail("RegType == REGT_INT",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                    ,0x13f,"void VMReturn::SetInt(int)");
                    }
                    *(uint *)ret->Location = (uint)bVar1;
                    iVar3 = 1;
                  }
                  FString::~FString(&local_30);
                  return iVar3;
                }
                pcVar4 = "param[paramnum].Type == REGT_INT";
              }
              __assert_fail(pcVar4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                            ,0xa38,
                            "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar4 = "param[paramnum].Type == REGT_INT";
          }
          __assert_fail(pcVar4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                        ,0xa37,
                        "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        pVVar2 = param;
        if (param[1].field_0.field_3.Type == '\0') goto LAB_002fe376;
        pcVar4 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                    ,0xa36,
                    "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar4 = "param[paramnum].Type == REGT_STRING";
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/s_sound.cpp"
                ,0xa35,
                "int AF_DObject_S_ChangeMusic(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(DObject, S_ChangeMusic)
{
	PARAM_PROLOGUE;
	PARAM_STRING(music);
	PARAM_INT_DEF(order);
	PARAM_BOOL(looping);
	PARAM_BOOL(force);
	ACTION_RETURN_BOOL(S_ChangeMusic(music, order, looping, force));
}